

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O3

SquareMatrix<2> __thiscall pbrt::SquareMatrix<2>::operator/(SquareMatrix<2> *this,Float s)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  SquareMatrix<2> SVar3;
  
  auVar2._4_4_ = s;
  auVar2._0_4_ = s;
  auVar2._8_4_ = s;
  auVar2._12_4_ = s;
  auVar2 = vdivps_avx(*(undefined1 (*) [16])this->m,auVar2);
  auVar1 = vshufpd_avx(auVar2,auVar2,1);
  SVar3.m[0] = auVar2._0_8_;
  SVar3.m[1] = auVar1._0_8_;
  return (SquareMatrix<2>)SVar3.m;
}

Assistant:

operator/(Float s) const {
        DCHECK_NE(s, 0);
        SquareMatrix r = *this;
        for (int i = 0; i < N; ++i)
            for (int j = 0; j < N; ++j)
                r.m[i][j] /= s;
        return r;
    }